

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

void ImGui::SFML::SetJoystickDPadThreshold(float threshold)

{
  if ((anonymous_namespace)::s_currWindowCtx == 0) {
    __assert_fail("s_currWindowCtx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x256,"void ImGui::SFML::SetJoystickDPadThreshold(float)");
  }
  if ((0.0 <= threshold) && (threshold <= 100.0)) {
    *(float *)((anonymous_namespace)::s_currWindowCtx + 0xb0) = threshold;
    return;
  }
  __assert_fail("threshold >= 0.f && threshold <= 100.f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-sfml-src/imgui-SFML.cpp"
                ,599,"void ImGui::SFML::SetJoystickDPadThreshold(float)");
}

Assistant:

void SetJoystickDPadThreshold(float threshold) {
    assert(s_currWindowCtx);
    assert(threshold >= 0.f && threshold <= 100.f);
    s_currWindowCtx->dPadInfo.threshold = threshold;
}